

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QCalendarWidgetPrivate::_q_monthChanged(QCalendarWidgetPrivate *this,QAction *act)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  long in_FS_OFFSET;
  QDate in_stack_00000008;
  QDate newDate;
  QDate currentDate;
  QString *text;
  QAbstractButton *this_00;
  QCalendarWidgetPrivate *in_stack_ffffffffffffff70;
  undefined1 **ppuVar3;
  QCalendarWidgetPrivate *this_01;
  undefined1 *local_48;
  undefined1 local_40 [56];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  text = *(QString **)(in_RDI + 0x298);
  this_00 = (QAbstractButton *)local_40;
  QAction::text();
  QAbstractButton::setText(this_00,text);
  QString::~QString((QString *)0x51ccf9);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = (undefined1 *)getCurrentDate(in_stack_ffffffffffffff70);
  this_01 = (QCalendarWidgetPrivate *)(local_40 + 0x18);
  QAction::data();
  iVar1 = ::QVariant::toInt((bool *)this_01);
  ppuVar3 = &local_48;
  iVar2 = QDate::month(ppuVar3,*(undefined8 *)(*(long *)(in_RDI + 600) + 0x18));
  QDate::addMonths(ppuVar3,iVar1 - iVar2,*(undefined8 *)(*(long *)(in_RDI + 600) + 0x18));
  ::QVariant::~QVariant((QVariant *)this_01);
  updateCurrentPage(this_01,in_stack_00000008);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::_q_monthChanged(QAction *act)
{
    monthButton->setText(act->text());
    QDate currentDate = getCurrentDate();
    QDate newDate = currentDate.addMonths(act->data().toInt() - currentDate.month(m_model->m_calendar), m_model->m_calendar);
    updateCurrentPage(newDate);
}